

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange
          (ConstraintsGroup *this,string *name,TimeRange *timeRange)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  element_type *peVar5;
  iterator iVar6;
  iterator iVar7;
  TimeRange *in_RDX;
  string *in_RSI;
  TimeRange *in_RDI;
  ostringstream errorMsg;
  iterator constraintIterator;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  *in_stack_fffffffffffffdb8;
  string local_1f8 [48];
  ostringstream local_1c8 [376];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_40 [4];
  TimeRange *local_20;
  string *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  TimeRange::AnyTime();
  bVar1 = TimeRange::operator==(in_RDX,in_RDI);
  if (bVar1) {
    uVar2 = numberOfConstraints((ConstraintsGroup *)0x3962d8);
    if (uVar2 != 1) {
      iDynTree::reportError
                ("ConstraintsGroup","updateTimeRange",
                 "Only one constraint is allowed in a group if the timeRange is AnyTime.");
      local_1 = 0;
      goto LAB_00396523;
    }
  }
  else {
    bVar1 = TimeRange::isValid(local_20);
    if (!bVar1) {
      iDynTree::reportError("ConstraintsGroup","updateTimeRange","Invalid timeRange.");
      local_1 = 0;
      goto LAB_00396523;
    }
  }
  std::__detail::
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
  ::_Node_iterator((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                    *)0x39634d);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
       ::find(in_stack_fffffffffffffdb8,(key_type *)0x396362);
  local_40[0]._M_cur = local_48._M_cur;
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
       ::end(in_stack_fffffffffffffdb8);
  bVar1 = std::__detail::operator==(local_40,&local_50);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar3 = std::operator<<((ostream *)local_1c8,"Unable to find constraint named ");
    poVar3 = std::operator<<(poVar3,local_18);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("ConstraintsGroup","updateTimeRange",pcVar4);
    std::__cxx11::string::~string(local_1f8);
    local_1 = 0;
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                  *)0x3964b4);
    peVar5 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3964c0);
    (peVar5->timeRange).m_initTime = local_20->m_initTime;
    (peVar5->timeRange).m_endTime = local_20->m_endTime;
    (peVar5->timeRange).m_anyTime = local_20->m_anyTime;
    iVar6 = std::
            vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
            ::begin((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                     *)in_stack_fffffffffffffdb8);
    iVar7 = std::
            vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
            ::end((vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
                   *)in_stack_fffffffffffffdb8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,iDynTree::optimalcontrol::ConstraintsGroup::updateTimeRange(std::__cxx11::string_const&,iDynTree::optimalcontrol::TimeRange_const&)::__0>
              (iVar6._M_current,iVar7._M_current);
    local_1 = 1;
  }
LAB_00396523:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConstraintsGroup::updateTimeRange(const std::string &name, const TimeRange &timeRange)
        {
            if (timeRange == TimeRange::AnyTime()){
                if (numberOfConstraints() != 1){
                    reportError("ConstraintsGroup", "updateTimeRange",
                                "Only one constraint is allowed in a group if the timeRange is AnyTime.");
                    return false;
                }
            } else {
                if (!timeRange.isValid()){
                    reportError("ConstraintsGroup", "updateTimeRange", "Invalid timeRange.");
                    return false;
                }
            }

            GroupOfConstraintsMap::iterator constraintIterator;
            constraintIterator = m_pimpl->group.find(name);
            if(constraintIterator == m_pimpl->group.end()){
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< std::endl;
                reportError("ConstraintsGroup", "updateTimeRange", errorMsg.str().c_str());
                return false;
            }

            constraintIterator->second->timeRange = timeRange;
            std::sort(m_pimpl->orderedIntervals.begin(), m_pimpl->orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector


            //the jacobian should be updated
            return true;
        }